

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::AppendAndMatch(ON_PolyCurve *this,ON_Curve *c)

{
  bool bVar1;
  int iVar2;
  ON_3dPoint local_48;
  ON_3dPoint local_30;
  
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count == 0) {
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    bVar1 = Insert(this,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count,c);
    return bVar1;
  }
  ON_Curve::PointAtEnd(&local_30,&this->super_ON_Curve);
  iVar2 = (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])(c);
  if ((char)iVar2 == '\0') {
    ON_Curve::PointAtStart(&local_48,c);
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])(this);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  bVar1 = Insert(this,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count,c);
  return bVar1;
}

Assistant:

bool ON_PolyCurve::AppendAndMatch(ON_Curve* c)

{
  if (Count() == 0) return Append(c);
  //if (IsClosed() || c->IsClosed()) return false;
  if (!c->SetStartPoint(PointAtEnd())){
    if (!SetEndPoint(c->PointAtStart()))
      return false;
  }
  return Append(c);
}